

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_gpio_set_multi(uint32_t mask)

{
  uint32_t *paddr;
  uint32_t mask_local;
  
  bcm2835_peri_write(bcm2835_gpio + 7,mask);
  return;
}

Assistant:

void bcm2835_gpio_set_multi(uint32_t mask)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPSET0/4;
    bcm2835_peri_write(paddr, mask);
}